

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFOutlineObjectHelper.hh
# Opt level: O3

void __thiscall QPDFOutlineObjectHelper::~QPDFOutlineObjectHelper(QPDFOutlineObjectHelper *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_QPDFObjectHelper)._vptr_QPDFObjectHelper =
       (_func_int **)&PTR__QPDFOutlineObjectHelper_002eed40;
  peVar1 = (this->m).
           super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (peVar1->parent).super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  p_Var2 = (peVar1->parent).super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (peVar1->parent).super___shared_ptr<QPDFOutlineObjectHelper,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  p_Var2 = (this->m).
           super___shared_ptr<QPDFOutlineObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  QPDFObjectHelper::~QPDFObjectHelper(&this->super_QPDFObjectHelper);
  return;
}

Assistant:

~QPDFOutlineObjectHelper() override
    {
        // This must be cleared explicitly to avoid circular references that prevent cleanup of
        // shared pointers.
        m->parent = nullptr;
    }